

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerpIntercept.cpp
# Opt level: O0

LLPoint GeoCalcs::PerpIntercept
                  (LLPoint *llPt1,double dCrs13,LLPoint *llPt2,double *dCrsFromPt,
                  double *dDistFromPt,double dTol)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  LLPoint LVar6;
  bool local_172;
  double oldDist13;
  double dError;
  int k;
  double local_108;
  double distarray [2];
  double errarray [2];
  double dist23;
  double crs32;
  double crs31;
  double local_c8;
  undefined1 local_c0 [8];
  LLPoint newPoint_1;
  double local_a8;
  undefined1 local_a0 [8];
  LLPoint newPoint;
  double dist13;
  double dAngle;
  LLPoint pt2;
  LLPoint pt1;
  InverseResult result;
  double dTol_local;
  double *dDistFromPt_local;
  double *dCrsFromPt_local;
  LLPoint *llPt2_local;
  double dCrs13_local;
  LLPoint *llPt1_local;
  LLPoint pt3;
  
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&pt1.longitude);
  pt2.longitude = llPt1->latitude;
  pt1.latitude = llPt1->longitude;
  dAngle = llPt2->latitude;
  pt2.latitude = llPt2->longitude;
  DistVincenty((LLPoint *)&pt2.longitude,(LLPoint *)&dAngle,(InverseResult *)&pt1.longitude);
  if (dTol < result.reverseAzimuth) {
    dVar2 = SignAzimuthDifference(dCrs13,pt1.longitude);
    dVar5 = kSphereRadius;
    dVar3 = tan(result.reverseAzimuth / kSphereRadius);
    dVar4 = cos(ABS(dVar2));
    dVar3 = atan(dVar3 * ABS(dVar4));
    newPoint.longitude = dVar5 * dVar3;
    if (ABS(dVar2) <= 1.5707963267948966) {
      dVar5 = ABS(newPoint.longitude);
      dVar2 = NmToMeters(150.0);
      llPt2_local = (LLPoint *)dCrs13;
      if (dVar5 < dVar2) {
        LLPOINT::LLPOINT((LLPOINT *)local_c0);
        dVar5 = NmToMeters(150.0);
        LVar6 = DestVincenty((LLPoint *)&pt2.longitude,dCrs13 + 3.141592653589793,dVar5);
        crs31 = LVar6.latitude;
        local_c0 = (undefined1  [8])crs31;
        local_c8 = LVar6.longitude;
        newPoint_1.latitude = local_c8;
        dVar5 = NmToMeters(150.0);
        newPoint.longitude = dVar5 + newPoint.longitude;
        DistVincenty((LLPoint *)local_c0,(LLPoint *)&pt2.longitude,(InverseResult *)&pt1.longitude);
        llPt2_local = (LLPoint *)pt1.longitude;
        pt2.longitude = (double)local_c0;
        pt1.latitude = newPoint_1.latitude;
      }
    }
    else {
      LLPOINT::LLPOINT((LLPOINT *)local_a0);
      dVar5 = newPoint.longitude;
      dVar2 = NmToMeters(150.0);
      join_0x00001240_0x00001200_ =
           DestVincenty((LLPoint *)&pt2.longitude,dCrs13 + 3.141592653589793,dVar5 + dVar2);
      local_a0 = (undefined1  [8])newPoint_1.longitude;
      newPoint.latitude = local_a8;
      newPoint.longitude = NmToMeters(150.0);
      DistVincenty((LLPoint *)local_a0,(LLPoint *)&pt2.longitude,(InverseResult *)&pt1.longitude);
      llPt2_local = (LLPoint *)pt1.longitude;
      pt2.longitude = (double)local_a0;
      pt1.latitude = newPoint.latitude;
    }
    _llPt1_local = DestVincenty((LLPoint *)&pt2.longitude,(double)llPt2_local,newPoint.longitude);
    DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&pt2.longitude,(InverseResult *)&pt1.longitude);
    dVar5 = pt1.longitude;
    DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&dAngle,(InverseResult *)&pt1.longitude);
    dVar5 = SignAzimuthDifference(dVar5,pt1.longitude);
    distarray[1] = ABS(dVar5) - 1.5707963267948966;
    local_108 = newPoint.longitude;
    distarray[0] = ABS(distarray[1] * result.reverseAzimuth + newPoint.longitude);
    _llPt1_local = DestVincenty((LLPoint *)&pt2.longitude,(double)llPt2_local,distarray[0]);
    DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&pt2.longitude,(InverseResult *)&pt1.longitude);
    dVar5 = pt1.longitude;
    DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&dAngle,(InverseResult *)&pt1.longitude);
    dist23 = pt1.longitude;
    dVar5 = SignAzimuthDifference(dVar5,pt1.longitude);
    dError._4_4_ = 0;
    oldDist13 = 0.0;
    while( true ) {
      dVar2 = newPoint.longitude;
      errarray[0] = ABS(dVar5) - 1.5707963267948966;
      local_172 = true;
      if (dError._4_4_ != 0) {
        local_172 = dTol < oldDist13 && dError._4_4_ < 0xf;
      }
      if (!local_172) break;
      FindLinearRoot(&local_108,distarray + 1,&newPoint.longitude);
      uVar1 = std::isnan(newPoint.longitude);
      if ((uVar1 & 1) == 0) {
        dVar2 = newPoint.longitude;
      }
      newPoint.longitude = dVar2;
      _llPt1_local = DestVincenty((LLPoint *)&pt2.longitude,(double)llPt2_local,newPoint.longitude);
      DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&pt2.longitude,(InverseResult *)&pt1.longitude
                  );
      dVar5 = pt1.longitude;
      DistVincenty((LLPoint *)&llPt1_local,(LLPoint *)&dAngle,(InverseResult *)&pt1.longitude);
      dist23 = pt1.longitude;
      local_108 = distarray[0];
      distarray[0] = newPoint.longitude;
      distarray[1] = errarray[0];
      dVar5 = SignAzimuthDifference(dVar5,pt1.longitude);
      oldDist13 = ABS(distarray[0] - local_108);
      dError._4_4_ = dError._4_4_ + 1;
    }
    *dCrsFromPt = dist23;
    *dDistFromPt = result.reverseAzimuth;
  }
  else {
    *dDistFromPt = 0.0;
    *dCrsFromPt = 0.0;
    pt3.latitude = pt1.latitude;
    llPt1_local = (LLPoint *)pt2.longitude;
  }
  return _llPt1_local;
}

Assistant:

LLPoint PerpIntercept(const LLPoint &llPt1, double dCrs13, const LLPoint &llPt2,
                          double &dCrsFromPt, double &dDistFromPt, double dTol)
    {
        InverseResult result;
        LLPoint pt1 = llPt1;
        LLPoint pt2 = llPt2;
        DistVincenty(pt1, pt2, result);

        if (result.distance <= dTol)
        {
            // pt1, pt2 and projected pt3 are all the same;
            dCrsFromPt = dDistFromPt = 0.0;
            return pt1;
        }


        const double dAngle = fabs(SignAzimuthDifference(dCrs13, result.azimuth));
        double dist13 = kSphereRadius * atan(tan(result.distance / kSphereRadius) * fabs(cos(dAngle)));

        if (dAngle > M_PI_2)
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, dist13 + NmToMeters(150.0));
            dist13 = NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }
        else if (fabs(dist13) < NmToMeters(150.0))
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, NmToMeters(150.0));
            dist13 += NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }

        LLPoint pt3 = DestVincenty(pt1, dCrs13, dist13);
        DistVincenty(pt3, pt1, result);
        double crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        double crs32 = result.azimuth;
        double dist23 = result.distance;

        double errarray[2], distarray[2];
        errarray[0] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
        distarray[0] = dist13;
        distarray[1] = fabs(distarray[0] + errarray[0] * dist23);

        pt3 = DestVincenty(pt1, dCrs13, distarray[1]);
        DistVincenty(pt3, pt1, result);
        crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        crs32 = result.azimuth;

        errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;

        int k = 0;
        double dError = 0.0;
        while (k == 0 || ((dError > dTol) && (k < 15)))
        {
            double oldDist13 = dist13;
            FindLinearRoot(distarray, errarray, dist13);
            if (std::isnan(dist13))
                dist13 = oldDist13;

            pt3 = DestVincenty(pt1, dCrs13, dist13);
            DistVincenty(pt3, pt1, result);
            crs31 = result.azimuth;

            DistVincenty(pt3, pt2, result);
            dist23 = result.distance;
            crs32 = result.azimuth;

            distarray[0] = distarray[1];
            distarray[1] = dist13;
            errarray[0] = errarray[1];
            errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
            dError = fabs(distarray[1] - distarray[0]);
            k++;
        }

        dCrsFromPt = crs32;
        dDistFromPt = dist23;
        return pt3;
    }